

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

void mpi_montmul(mbedtls_mpi *A,mbedtls_mpi *B,mbedtls_mpi *N,mbedtls_mpi_uint mm,mbedtls_mpi *T)

{
  mbedtls_mpi_uint *d;
  size_t n;
  mbedtls_mpi_uint *pmVar1;
  mbedtls_mpi_uint *__dest;
  mbedtls_mpi_uint b;
  mbedtls_mpi_uint mVar2;
  mbedtls_mpi_uint mVar3;
  int iVar4;
  ulong i;
  mbedtls_mpi_uint **ppmVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  
  lVar7 = 0;
  memset(T->p,0,T->n << 3);
  n = N->n;
  i = B->n;
  if (n <= B->n) {
    i = n;
  }
  pmVar1 = T->p;
  sVar6 = n;
  while( true ) {
    d = (mbedtls_mpi_uint *)((long)pmVar1 + lVar7);
    __dest = A->p;
    bVar8 = sVar6 == 0;
    sVar6 = sVar6 - 1;
    if (bVar8) break;
    b = *(mbedtls_mpi_uint *)((long)__dest + lVar7);
    mVar2 = *B->p;
    mVar3 = *d;
    mpi_mul_hlp(i,B->p,d,b);
    mpi_mul_hlp(n,N->p,d,(mVar2 * b + mVar3) * mm);
    *d = b;
    *(undefined8 *)((long)pmVar1 + lVar7 + n * 8 + 0x10) = 0;
    lVar7 = lVar7 + 8;
  }
  memcpy(__dest,d,n * 8 + 8);
  iVar4 = mbedtls_mpi_cmp_abs(A,N);
  ppmVar5 = &T->p;
  if (-1 < iVar4) {
    ppmVar5 = &A->p;
    A = N;
  }
  mpi_sub_hlp(n,A->p,*ppmVar5);
  return;
}

Assistant:

static void mpi_montmul( mbedtls_mpi *A, const mbedtls_mpi *B, const mbedtls_mpi *N, mbedtls_mpi_uint mm,
                         const mbedtls_mpi *T )
{
    size_t i, n, m;
    mbedtls_mpi_uint u0, u1, *d;

    memset( T->p, 0, T->n * ciL );

    d = T->p;
    n = N->n;
    m = ( B->n < n ) ? B->n : n;

    for( i = 0; i < n; i++ )
    {
        /*
         * T = (T + u0*B + u1*N) / 2^biL
         */
        u0 = A->p[i];
        u1 = ( d[0] + u0 * B->p[0] ) * mm;

        mpi_mul_hlp( m, B->p, d, u0 );
        mpi_mul_hlp( n, N->p, d, u1 );

        *d++ = u0; d[n + 1] = 0;
    }

    memcpy( A->p, d, ( n + 1 ) * ciL );

    if( mbedtls_mpi_cmp_abs( A, N ) >= 0 )
        mpi_sub_hlp( n, N->p, A->p );
    else
        /* prevent timing attacks */
        mpi_sub_hlp( n, A->p, T->p );
}